

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive.cpp
# Opt level: O3

bool wallet::CachedTxIsTrusted
               (CWallet *wallet,CWalletTx *wtx,
               set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *trusted_parents)

{
  __index_type _Var1;
  element_type *peVar2;
  pointer pCVar3;
  bool bVar4;
  isminetype iVar5;
  CAmount CVar6;
  CWalletTx *wtx_00;
  const_iterator cVar7;
  bool bVar8;
  CTxIn *txin;
  pointer hash;
  long in_FS_OFFSET;
  isminefilter local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  _Var1 = *(__index_type *)
           ((long)&(wtx->m_state).
                   super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                   .
                   super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                   .
                   super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                   .
                   super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                   .
                   super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                   .
                   super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           + 0x28);
  bVar8 = true;
  if (_Var1 != '\0') {
    if ((_Var1 != '\x02') && (wallet->m_spend_zero_conf_change == true)) {
      local_3c = 3;
      CVar6 = CachedTxGetDebit(wallet,wtx,&local_3c);
      if ((0 < CVar6) && (bVar4 = CWalletTx::InMempool(wtx), bVar4)) {
        peVar2 = (wtx->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        hash = (peVar2->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start;
        pCVar3 = (peVar2->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (hash != pCVar3) {
          do {
            wtx_00 = CWallet::GetWalletTx(wallet,(uint256 *)hash);
            if ((wtx_00 == (CWalletTx *)0x0) ||
               (iVar5 = CWallet::IsMine(wallet,(((wtx_00->tx).
                                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr)->vout).
                                               super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                               _M_impl.super__Vector_impl_data._M_start +
                                               (hash->prevout).n), iVar5 != ISMINE_SPENDABLE))
            goto LAB_00b8732f;
            cVar7 = std::
                    _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
                    ::find(&trusted_parents->_M_t,
                           &(((wtx_00->tx).
                              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->hash).m_wrapped);
            if ((_Rb_tree_header *)cVar7._M_node ==
                &(trusted_parents->_M_t)._M_impl.super__Rb_tree_header) {
              bVar4 = CachedTxIsTrusted(wallet,wtx_00,trusted_parents);
              if (!bVar4) goto LAB_00b8732f;
              std::
              _Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>
              ::_M_insert_unique<uint256_const&>
                        ((_Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>
                          *)trusted_parents,
                         &(((wtx_00->tx).
                            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->hash).m_wrapped);
            }
            hash = hash + 1;
          } while (hash != pCVar3);
        }
        goto LAB_00b87331;
      }
    }
LAB_00b8732f:
    bVar8 = false;
  }
LAB_00b87331:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar8;
}

Assistant:

bool CachedTxIsTrusted(const CWallet& wallet, const CWalletTx& wtx, std::set<uint256>& trusted_parents)
{
    AssertLockHeld(wallet.cs_wallet);
    if (wtx.isConfirmed()) return true;
    if (wtx.isBlockConflicted()) return false;
    // using wtx's cached debit
    if (!wallet.m_spend_zero_conf_change || !CachedTxIsFromMe(wallet, wtx, ISMINE_ALL)) return false;

    // Don't trust unconfirmed transactions from us unless they are in the mempool.
    if (!wtx.InMempool()) return false;

    // Trusted if all inputs are from us and are in the mempool:
    for (const CTxIn& txin : wtx.tx->vin)
    {
        // Transactions not sent by us: not trusted
        const CWalletTx* parent = wallet.GetWalletTx(txin.prevout.hash);
        if (parent == nullptr) return false;
        const CTxOut& parentOut = parent->tx->vout[txin.prevout.n];
        // Check that this specific input being spent is trusted
        if (wallet.IsMine(parentOut) != ISMINE_SPENDABLE) return false;
        // If we've already trusted this parent, continue
        if (trusted_parents.count(parent->GetHash())) continue;
        // Recurse to check that the parent is also trusted
        if (!CachedTxIsTrusted(wallet, *parent, trusted_parents)) return false;
        trusted_parents.insert(parent->GetHash());
    }
    return true;
}